

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollable.c
# Opt level: O2

int nni_pollable_getfd(nni_pollable *p,int *fdp)

{
  _Bool _Var1;
  int iVar2;
  long in_RAX;
  uint64_t uVar3;
  undefined8 local_38;
  int rfd;
  int wfd;
  
  if (p == (nni_pollable *)0x0) {
    return 3;
  }
  local_38 = in_RAX;
  do {
    uVar3 = nni_atomic_get64(&p->p_fds);
    if (uVar3 != 0xffffffffffffffff) {
      local_38._0_4_ = (int)(uVar3 >> 0x20);
LAB_00128db1:
      *fdp = (int)local_38;
      return 0;
    }
    iVar2 = nni_plat_pipe_open((int *)((long)&local_38 + 4),(int *)&local_38);
    if (iVar2 != 0) {
      return iVar2;
    }
    _Var1 = nni_atomic_cas64(&p->p_fds,0xffffffffffffffff,(local_38 << 0x20) + (long)local_38._4_4_)
    ;
    if (_Var1) {
      _Var1 = nni_atomic_get_bool(&p->p_raised);
      if (_Var1) {
        nni_plat_pipe_raise(local_38._4_4_);
      }
      goto LAB_00128db1;
    }
    nni_plat_pipe_close(local_38._4_4_,(int)local_38);
  } while( true );
}

Assistant:

int
nni_pollable_getfd(nni_pollable *p, int *fdp)
{
	if (p == NULL) {
		return (NNG_EINVAL);
	}

	for (;;) {
		int      rfd;
		int      wfd;
		int      rv;
		uint64_t fds;

		if ((fds = nni_atomic_get64(&p->p_fds)) != (uint64_t) -1) {
			*fdp = RFD(fds);
			return (0);
		}
		if ((rv = nni_plat_pipe_open(&wfd, &rfd)) != 0) {
			return (rv);
		}
		fds = FD_JOIN(wfd, rfd);

		if (nni_atomic_cas64(&p->p_fds, (uint64_t) -1, fds)) {
			if (nni_atomic_get_bool(&p->p_raised)) {
				nni_plat_pipe_raise(wfd);
			}
			*fdp = rfd;
			return (0);
		}

		// Someone beat us.  Close ours, and try again.
		nni_plat_pipe_close(wfd, rfd);
	}
}